

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
emplace<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
          (iterator *__return_storage_ptr__,void *this,unsigned_long_long *key,
          shared_ptr<const_QGradientCache::CacheInfo> *args)

{
  element_type *peVar1;
  long in_FS_OFFSET;
  __shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = *this;
  if (peVar1 == (element_type *)0x0) {
    local_40._M_ptr = (element_type *)0x0;
    local_40._M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)this + 8);
LAB_0037c525:
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::detach
              ((QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *)
               this);
    emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
              (__return_storage_ptr__,this,key,args);
    QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::~QMultiHash
              ((QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *)
               &local_40);
  }
  else {
    if (1 < (uint)peVar1->buffer64[0].rgba) {
      local_40._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)this + 8);
      local_40._M_ptr = peVar1;
      if ((int)peVar1->buffer64[0].rgba != -1) {
        LOCK();
        *(int *)&peVar1->buffer64[0].rgba = (int)peVar1->buffer64[0].rgba + 1;
        UNLOCK();
      }
      goto LAB_0037c525;
    }
    if (peVar1->buffer64[1].rgba < peVar1->buffer64[2].rgba >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
                  (__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_0037c596;
    }
    std::__shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &args->
                super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>);
    emplace_helper<std::shared_ptr<QGradientCache::CacheInfo_const>>
              (__return_storage_ptr__,this,key,
               (shared_ptr<const_QGradientCache::CacheInfo> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0037c596:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }